

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdt.cpp
# Opt level: O0

void __thiscall CDT::CDT(CDT *this,DataSet *dataset,uint n_input,bool dc_sort)

{
  bool dc_sort_local;
  uint n_input_local;
  DataSet *dataset_local;
  CDT *this_local;
  
  DataSet::DataSet(&this->m_dataset);
  std::vector<Layer,_std::allocator<Layer>_>::vector(&this->m_layers);
  Matrix<double>::Matrix(&this->m_input);
  Matrix<double>::Matrix(&this->m_output);
  Activation::Activation(&this->m_function);
  Info::Info(&this->m_info);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->m_cdt_indices);
  set(this,dataset,n_input,dc_sort);
  (this->m_function).m_optimization.fit_func = NO_FIT;
  (this->m_function).m_optimization.split_dist = HALF;
  (this->m_function).m_optimization.confidence = 5;
  return;
}

Assistant:

CDT::CDT(const DataSet& dataset, unsigned n_input, bool dc_sort){
    set(dataset, n_input, dc_sort);
    m_function.m_optimization=Optimization{NO_FIT, HALF, 5};
}